

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_arith_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int imm)

{
  TCGContext_conflict6 *tcg_ctx_00;
  ulong arg2;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGLabel *pTVar4;
  TCGLabel *l1_1;
  TCGv_i64 t2_1;
  TCGv_i64 t1_1;
  TCGv_i64 t0_1;
  TCGLabel *l1;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  target_ulong uimm;
  TCGContext_conflict6 *tcg_ctx;
  int imm_local;
  int rs_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg2 = (ulong)imm;
  if (((rt != 0) || (opc == 0x20000000)) || (opc == 0x60000000)) {
    if (opc == 0x20000000) {
      pTVar1 = tcg_temp_local_new_i64(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = gen_new_label_mips64el(tcg_ctx_00);
      gen_load_gpr(tcg_ctx_00,pTVar2,rs);
      tcg_gen_addi_i64_mips64el(tcg_ctx_00,pTVar1,pTVar2,arg2);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,pTVar1,pTVar1);
      tcg_gen_xori_i64_mips64el(tcg_ctx_00,pTVar2,pTVar2,arg2 ^ 0xffffffffffffffff);
      tcg_gen_xori_i64_mips64el(tcg_ctx_00,pTVar3,pTVar1,arg2);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar2,pTVar2,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_GE,pTVar2,0,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
      generate_exception(ctx,0x15);
      gen_set_label(tcg_ctx_00,pTVar4);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,pTVar1,pTVar1);
      gen_store_gpr(tcg_ctx_00,pTVar1,rt);
      tcg_temp_free_i64(tcg_ctx_00,pTVar1);
    }
    else if (opc == 0x24000000) {
      if (rs == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],arg2);
      }
      else {
        tcg_gen_addi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rs],arg2);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt]);
      }
    }
    else if (opc == 0x60000000) {
      pTVar1 = tcg_temp_local_new_i64(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = gen_new_label_mips64el(tcg_ctx_00);
      gen_load_gpr(tcg_ctx_00,pTVar2,rs);
      tcg_gen_addi_i64_mips64el(tcg_ctx_00,pTVar1,pTVar2,arg2);
      tcg_gen_xori_i64_mips64el(tcg_ctx_00,pTVar2,pTVar2,arg2 ^ 0xffffffffffffffff);
      tcg_gen_xori_i64_mips64el(tcg_ctx_00,pTVar3,pTVar1,arg2);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar2,pTVar2,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_GE,pTVar2,0,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
      generate_exception(ctx,0x15);
      gen_set_label(tcg_ctx_00,pTVar4);
      gen_store_gpr(tcg_ctx_00,pTVar1,rt);
      tcg_temp_free_i64(tcg_ctx_00,pTVar1);
    }
    else if (opc == 0x64000000) {
      if (rs == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],arg2);
      }
      else {
        tcg_gen_addi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rs],arg2);
      }
    }
  }
  return;
}

Assistant:

static void gen_arith_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = (target_long)imm; /* Sign extend to 32/64 bits */

    if (rt == 0 && opc != OPC_ADDI && opc != OPC_DADDI) {
        /*
         * If no destination, treat it as a NOP.
         * For addi, we must generate the overflow exception when needed.
         */
        return;
    }
    switch (opc) {
    case OPC_ADDI:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            tcg_gen_addi_tl(tcg_ctx, t0, t1, uimm);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);

            tcg_gen_xori_tl(tcg_ctx, t1, t1, ~uimm);
            tcg_gen_xori_tl(tcg_ctx, t2, t0, uimm);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_ADDIU:
        if (rs != 0) {
            tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DADDI:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            tcg_gen_addi_tl(tcg_ctx, t0, t1, uimm);

            tcg_gen_xori_tl(tcg_ctx, t1, t1, ~uimm);
            tcg_gen_xori_tl(tcg_ctx, t2, t0, uimm);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DADDIU:
        if (rs != 0) {
            tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
#endif
    }
}